

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.cpp
# Opt level: O0

RPCHelpMan * wallet::getreceivedbylabel(void)

{
  initializer_list<RPCArg> __l;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_fffffffffffff328;
  RPCArg *this;
  UniValue *in_stack_fffffffffffff330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff360;
  UniValue *in_stack_fffffffffffff368;
  undefined1 *puVar2;
  iterator in_stack_fffffffffffff370;
  RPCArgOptions *in_stack_fffffffffffff378;
  string *in_stack_fffffffffffff380;
  Fallback *in_stack_fffffffffffff388;
  undefined1 skip_type_check;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_fffffffffffff390;
  string *in_stack_fffffffffffff398;
  RPCArg *in_stack_fffffffffffff3a0;
  RPCResults *in_stack_fffffffffffff3a8;
  RPCResult *in_stack_fffffffffffff3b0;
  RPCExamples *in_stack_fffffffffffff470;
  RPCHelpMan *results;
  vector<RPCArg,_std::allocator<RPCArg>_> *in_stack_fffffffffffff480;
  _Alloc_hider in_stack_fffffffffffff488;
  string *in_stack_fffffffffffff490;
  undefined8 in_stack_fffffffffffff498;
  allocator<char> local_b52;
  allocator<char> local_b51;
  allocator<char> local_b50;
  allocator<char> local_b4f;
  allocator<char> local_b4e;
  allocator<char> local_b4d;
  allocator<char> local_b4c;
  allocator<char> local_b4b;
  allocator<char> local_b4a;
  allocator<char> local_b49;
  pointer local_b48;
  pointer pRStack_b40;
  undefined1 local_b38 [52];
  allocator<char> local_b04 [2];
  allocator<char> local_b02;
  allocator<char> local_b01 [7];
  allocator<char> local_afa;
  allocator<char> local_af9 [8];
  allocator<char> local_af1 [31];
  allocator<char> local_ad2;
  allocator<char> local_ad1 [97];
  RPCMethodImpl *in_stack_fffffffffffff590;
  undefined1 local_360 [792];
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  results = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff378,(char *)in_stack_fffffffffffff370,
             (allocator<char> *)in_stack_fffffffffffff368);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff378,(char *)in_stack_fffffffffffff370,
             (allocator<char> *)in_stack_fffffffffffff368);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff378,(char *)in_stack_fffffffffffff370,
             (allocator<char> *)in_stack_fffffffffffff368);
  local_af9[1] = (allocator<char>)0x0;
  local_af9[2] = (allocator<char>)0x0;
  local_af9[3] = (allocator<char>)0x0;
  local_af9[4] = (allocator<char>)0x0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff338,&in_stack_fffffffffffff330->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff378,(char *)in_stack_fffffffffffff370,
             (allocator<char> *)in_stack_fffffffffffff368);
  std::__cxx11::string::string(in_stack_fffffffffffff340);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff328);
  RPCArg::RPCArg(in_stack_fffffffffffff3a0,in_stack_fffffffffffff398,
                 (Type)((ulong)in_stack_fffffffffffff390 >> 0x20),in_stack_fffffffffffff388,
                 in_stack_fffffffffffff380,in_stack_fffffffffffff378);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff378,(char *)in_stack_fffffffffffff370,
             (allocator<char> *)in_stack_fffffffffffff368);
  local_b01[1] = (allocator<char>)0x1;
  local_b01[2] = (allocator<char>)0x0;
  local_b01[3] = (allocator<char>)0x0;
  local_b01[4] = (allocator<char>)0x0;
  UniValue::UniValue<int,_int,_true>(in_stack_fffffffffffff368,(int *)in_stack_fffffffffffff360);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff338,in_stack_fffffffffffff330);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff378,(char *)in_stack_fffffffffffff370,
             (allocator<char> *)in_stack_fffffffffffff368);
  std::__cxx11::string::string(in_stack_fffffffffffff340);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff328);
  RPCArg::RPCArg(in_stack_fffffffffffff3a0,in_stack_fffffffffffff398,
                 (Type)((ulong)in_stack_fffffffffffff390 >> 0x20),in_stack_fffffffffffff388,
                 in_stack_fffffffffffff380,in_stack_fffffffffffff378);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff378,(char *)in_stack_fffffffffffff370,
             (allocator<char> *)in_stack_fffffffffffff368);
  local_b04[1] = (allocator<char>)0x0;
  UniValue::UniValue<bool,_bool,_true>(in_stack_fffffffffffff368,(bool *)in_stack_fffffffffffff360);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff338,in_stack_fffffffffffff330);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff378,(char *)in_stack_fffffffffffff370,
             (allocator<char> *)in_stack_fffffffffffff368);
  std::__cxx11::string::string(in_stack_fffffffffffff340);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff328);
  RPCArg::RPCArg(in_stack_fffffffffffff3a0,in_stack_fffffffffffff398,
                 (Type)((ulong)in_stack_fffffffffffff390 >> 0x20),in_stack_fffffffffffff388,
                 in_stack_fffffffffffff380,in_stack_fffffffffffff378);
  skip_type_check = (undefined1)((ulong)in_stack_fffffffffffff388 >> 0x38);
  std::allocator<RPCArg>::allocator(in_stack_fffffffffffff328);
  __l._M_len = (size_type)in_stack_fffffffffffff378;
  __l._M_array = in_stack_fffffffffffff370;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff368,__l,
             (allocator_type *)in_stack_fffffffffffff360);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff378,(char *)in_stack_fffffffffffff370,
             (allocator<char> *)in_stack_fffffffffffff368);
  std::operator+(&in_stack_fffffffffffff378->skip_type_check,&in_stack_fffffffffffff370->m_names);
  std::operator+(in_stack_fffffffffffff340,(char *)in_stack_fffffffffffff338);
  local_b48 = (pointer)0x0;
  pRStack_b40 = (pointer)0x0;
  local_b38._0_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff328);
  RPCResult::RPCResult
            (in_stack_fffffffffffff3b0,(Type)((ulong)in_stack_fffffffffffff3a8 >> 0x20),
             &in_stack_fffffffffffff3a0->m_names,in_stack_fffffffffffff398,in_stack_fffffffffffff390
             ,(bool)skip_type_check);
  RPCResults::RPCResults(in_stack_fffffffffffff3a8,(RPCResult *)in_stack_fffffffffffff3a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff378,(char *)in_stack_fffffffffffff370,
             (allocator<char> *)in_stack_fffffffffffff368);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff378,(char *)in_stack_fffffffffffff370,
             (allocator<char> *)in_stack_fffffffffffff368);
  HelpExampleCli(in_stack_fffffffffffff360,in_stack_fffffffffffff358);
  std::operator+((char *)in_stack_fffffffffffff340,in_stack_fffffffffffff338);
  std::operator+(in_stack_fffffffffffff340,(char *)in_stack_fffffffffffff338);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff378,(char *)in_stack_fffffffffffff370,
             (allocator<char> *)in_stack_fffffffffffff368);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff378,(char *)in_stack_fffffffffffff370,
             (allocator<char> *)in_stack_fffffffffffff368);
  HelpExampleCli(in_stack_fffffffffffff360,in_stack_fffffffffffff358);
  std::operator+(in_stack_fffffffffffff360,in_stack_fffffffffffff358);
  std::operator+(in_stack_fffffffffffff340,(char *)in_stack_fffffffffffff338);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff378,(char *)in_stack_fffffffffffff370,
             (allocator<char> *)in_stack_fffffffffffff368);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff378,(char *)in_stack_fffffffffffff370,
             (allocator<char> *)in_stack_fffffffffffff368);
  HelpExampleCli(in_stack_fffffffffffff360,in_stack_fffffffffffff358);
  std::operator+(in_stack_fffffffffffff360,in_stack_fffffffffffff358);
  std::operator+(in_stack_fffffffffffff340,(char *)in_stack_fffffffffffff338);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff378,(char *)in_stack_fffffffffffff370,
             (allocator<char> *)in_stack_fffffffffffff368);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff378,(char *)in_stack_fffffffffffff370,
             (allocator<char> *)in_stack_fffffffffffff368);
  HelpExampleCli(in_stack_fffffffffffff360,in_stack_fffffffffffff358);
  std::operator+(in_stack_fffffffffffff360,in_stack_fffffffffffff358);
  std::operator+(in_stack_fffffffffffff340,(char *)in_stack_fffffffffffff338);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff378,(char *)in_stack_fffffffffffff370,
             (allocator<char> *)in_stack_fffffffffffff368);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff378,(char *)in_stack_fffffffffffff370,
             (allocator<char> *)in_stack_fffffffffffff368);
  HelpExampleRpc(in_stack_fffffffffffff360,in_stack_fffffffffffff358);
  std::operator+(in_stack_fffffffffffff360,in_stack_fffffffffffff358);
  RPCExamples::RPCExamples((RPCExamples *)in_stack_fffffffffffff328,(string *)0xc574eb);
  this = (RPCArg *)&stack0xfffffffffffff488;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<wallet::getreceivedbylabel()::__0,void>
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)
             in_stack_fffffffffffff338,(anon_class_1_0_00000001 *)in_stack_fffffffffffff330);
  RPCHelpMan::RPCHelpMan
            ((RPCHelpMan *)in_stack_fffffffffffff498,in_stack_fffffffffffff490,
             (string *)in_stack_fffffffffffff488._M_p,in_stack_fffffffffffff480,
             (RPCResults *)results,in_stack_fffffffffffff470,in_stack_fffffffffffff590);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_b52);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_b51);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_b50);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_b4f);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_b4e);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_b4d);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_b4c);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_b4b);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_b4a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_b49);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult((RPCResult *)this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff338);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_b38 + 0x17));
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff338);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  puVar2 = local_360;
  puVar1 = local_48;
  do {
    puVar1 = puVar1 + -0x108;
    RPCArg::~RPCArg(this);
  } while (puVar1 != puVar2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_b04);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  UniValue::~UniValue((UniValue *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_b02);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_b01);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  UniValue::~UniValue((UniValue *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_afa);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_af9);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_af1);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_ad2);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_ad1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan getreceivedbylabel()
{
    return RPCHelpMan{"getreceivedbylabel",
                "\nReturns the total amount received by addresses with <label> in transactions with at least [minconf] confirmations.\n",
                {
                    {"label", RPCArg::Type::STR, RPCArg::Optional::NO, "The selected label, may be the default label using \"\"."},
                    {"minconf", RPCArg::Type::NUM, RPCArg::Default{1}, "Only include transactions confirmed at least this many times."},
                    {"include_immature_coinbase", RPCArg::Type::BOOL, RPCArg::Default{false}, "Include immature coinbase transactions."},
                },
                RPCResult{
                    RPCResult::Type::STR_AMOUNT, "amount", "The total amount in " + CURRENCY_UNIT + " received for this label."
                },
                RPCExamples{
            "\nAmount received by the default label with at least 1 confirmation\n"
            + HelpExampleCli("getreceivedbylabel", "\"\"") +
            "\nAmount received at the tabby label including unconfirmed amounts with zero confirmations\n"
            + HelpExampleCli("getreceivedbylabel", "\"tabby\" 0") +
            "\nThe amount with at least 6 confirmations\n"
            + HelpExampleCli("getreceivedbylabel", "\"tabby\" 6") +
            "\nThe amount with at least 6 confirmations including immature coinbase outputs\n"
            + HelpExampleCli("getreceivedbylabel", "\"tabby\" 6 true") +
            "\nAs a JSON-RPC call\n"
            + HelpExampleRpc("getreceivedbylabel", "\"tabby\", 6, true")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    const std::shared_ptr<const CWallet> pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    // Make sure the results are valid at least up to the most recent block
    // the user could have gotten from another RPC command prior to now
    pwallet->BlockUntilSyncedToCurrentChain();

    LOCK(pwallet->cs_wallet);

    return ValueFromAmount(GetReceived(*pwallet, request.params, /*by_label=*/true));
},
    };
}